

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O0

void * CommandsThread(void *pParam)

{
  char *pcVar1;
  char local_118 [8];
  char line [256];
  void *pParam_local;
  
  printf("Type a command (e.g. help) or exit to terminate the program.\n");
  do {
    memset(local_118,0,0x100);
    pcVar1 = fgets3(_stdin,local_118,0x100);
    if (pcVar1 == (char *)0x0) {
      if (bExit != 0) {
        return (void *)0x0;
      }
      printf("Invalid command or stdin failure.\n");
      mSleep(100);
    }
    else {
      if (bExit != 0) {
        return (void *)0x0;
      }
      Commands(local_118);
    }
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE CommandsThread(void* pParam)
{
	char line[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	printf("Type a command (e.g. help) or exit to terminate the program.\n");

	// Read and execute commands from stdin.
	for (;;)
	{
		// fgets() should be a blocking call.
		// How to cancel it properly?

		memset(line, 0, sizeof(line));
		if (fgets3(stdin, line, sizeof(line)) != NULL)
		{
			if (bExit) break;
			Commands(line);
		}
		else
		{
			if (bExit) break;
			printf("Invalid command or stdin failure.\n");
			mSleep(100);
		}

		if (bExit) break;
	}

	return 0;
}